

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[29],kj::_::DebugComparison<kj::Ptr<kj::(anonymous_namespace)::Obj>&,kj::Pin<kj::(anonymous_namespace)::Obj2>&>&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [29],
               DebugComparison<kj::Ptr<kj::(anonymous_namespace)::Obj>_&,_kj::Pin<kj::(anonymous_namespace)::Obj2>_&>
               *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  String argValues [2];
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  char *apcStack_88 [2];
  size_t sStack_78;
  ArrayDisposer *pAStack_70;
  String local_68;
  StringPtr local_48;
  char *local_38;
  undefined8 local_30;
  
  str<char_const(&)[29]>
            ((String *)&stack0xffffffffffffff68,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [29])CONCAT44(in_register_00000014,severity));
  local_38 = "(can\'t stringify)";
  local_30 = 0x12;
  local_48.content.ptr = "(can\'t stringify)";
  local_48.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_68,(_ *)&local_38,(StringPtr *)(macroArgs + 0x10),&local_48,(StringPtr *)params)
  ;
  apcStack_88[1] = local_68.content.ptr;
  sStack_78 = local_68.content.size_;
  pAStack_70 = local_68.content.disposer;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line,&stack0xffffffffffffff68,
              in_stack_ffffffffffffff68);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)apcStack_88 + lVar3))
                (*(undefined8 **)((long)apcStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}